

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_acars_apps.c
# Opt level: O2

void usage(void)

{
  fwrite("decode_acars_apps - an example decoder of ACARS applications\n(c) 2018-2023 Tomasz Lemiech <szpajder@gmail.com>\n\nUsage:\n\nTo decode a single message from command line:\n\n\t./decode_acars_apps <direction> <acars_label> <acars_message_text>\n\nwhere <direction> is one of:\n\tu - means \"uplink\" (ground-to-air message)\n\td - means \"downlink\" (air-to-ground message)\n\nEnclose ACARS message text in quotes if it contains spaces or other shell\nspecial shell characters, like \'#\'.\n\nExample: ./decode_acars_apps d B6 \'/BOMASAI.ADS.VT-ANB072501A070A988CA73248F0E5DC10200000F5EE1ABC000102B885E0A19F5\'\n\nTo decode multiple messages from a text file:\n\n1. Prepare a file with multiple messages, one per line. Precede each line\n   with \'u\' or \'d\' (to indicate message direction) and a space. Direction\n   indicator must appear as a first character on the line (no preceding\n   spaces please). Example:\n\nu AA /AKLCDYA.AT1.9M-MTB215B659D84995674293583561CB9906744E9AF40F9EB\nd B6 /CTUE1YA.ADS.HB-JNB1424AB686D9308CA2EBA1D0D24A2C06C1B48CA004A248050667908CA004BF6\nd BA /MSTEC7X.AT1.VT-ANE21409DCC3DD03BB52350490502B2E5129D5A15692BA009A08892E7CC831E210A4C06EEBC28B1662BC02360165C80E1F7\nu H1 - #MD/AA ATLTWXA.CR1.N856DN203A3AA8E5C1A9323EDD\nd SA 0EV192001VS\nd H1 #T2BT-3![[mS0L8ZeIK0?J|EDDF\n\n2. Run decode_acars_apps and pipe the the file contents on standard input:\n\n\t./decode_acars_apps < messages.txt\n\nNote: ACARS label is used to identify the application (protocol) carried in\nthe message text. Messages with an incorrect label value won\'t be decoded,\nbecause the library won\'t know, which decoder to execute.\n\nACARS label cheat sheet:\n- ARINC 622 ATS applications (ADS-C, CPDLC): A6, AA, B6, BA, H1\n- Media Advisory: SA\n- MIAM: MA (or H1 - if prefixed with a sublabel)\n\ndecode_acars_apps produces human-readable text output by default.\nTo switch to JSON output, set LA_JSON environment variable to any value.\n"
         ,0x75b,1,_stderr);
  return;
}

Assistant:

void usage() {
	fprintf(stderr,
			"decode_acars_apps - an example decoder of ACARS applications\n"
			"(c) 2018-2023 Tomasz Lemiech <szpajder@gmail.com>\n\n"
			"Usage:\n\n"
			"To decode a single message from command line:\n\n"
			"\t./decode_acars_apps <direction> <acars_label> <acars_message_text>\n\n"
			"where <direction> is one of:\n"
			"\tu - means \"uplink\" (ground-to-air message)\n"
			"\td - means \"downlink\" (air-to-ground message)\n\n"
			"Enclose ACARS message text in quotes if it contains spaces or other shell\n"
			"special shell characters, like '#'.\n\n"
			"Example: ./decode_acars_apps d B6 '/BOMASAI.ADS.VT-ANB072501A070A988CA73248F0E5DC10200000F5EE1ABC000102B885E0A19F5'\n\n"
			"To decode multiple messages from a text file:\n\n"
			"1. Prepare a file with multiple messages, one per line. Precede each line\n"
			"   with 'u' or 'd' (to indicate message direction) and a space. Direction\n"
			"   indicator must appear as a first character on the line (no preceding\n"
			"   spaces please). Example:\n\n"
			"u AA /AKLCDYA.AT1.9M-MTB215B659D84995674293583561CB9906744E9AF40F9EB\n"
			"d B6 /CTUE1YA.ADS.HB-JNB1424AB686D9308CA2EBA1D0D24A2C06C1B48CA004A248050667908CA004BF6\n"
			"d BA /MSTEC7X.AT1.VT-ANE21409DCC3DD03BB52350490502B2E5129D5A15692BA009A08892E7CC831E210A4C06EEBC28B1662BC02360165C80E1F7\n"
			"u H1 - #MD/AA ATLTWXA.CR1.N856DN203A3AA8E5C1A9323EDD\n"
			"d SA 0EV192001VS\n"
			"d H1 #T2BT-3![[mS0L8ZeIK0?J|EDDF\n\n"
			"2. Run decode_acars_apps and pipe the the file contents on standard input:\n\n"
			"\t./decode_acars_apps < messages.txt\n\n"
			"Note: ACARS label is used to identify the application (protocol) carried in\n"
			"the message text. Messages with an incorrect label value won't be decoded,\n"
			"because the library won't know, which decoder to execute.\n\nACARS label cheat sheet:\n"
			"- ARINC 622 ATS applications (ADS-C, CPDLC): A6, AA, B6, BA, H1\n"
			"- Media Advisory: SA\n"
			"- MIAM: MA (or H1 - if prefixed with a sublabel)\n\n"
			"decode_acars_apps produces human-readable text output by default.\n"
			"To switch to JSON output, set LA_JSON environment variable to any value.\n"
			);
}